

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

ParseNodeCall * __thiscall
Parser::CreateCallNode
          (Parser *this,OpCode nop,ParseNodePtr pnode1,ParseNodePtr pnode2,charcount_t ichMin,
          charcount_t ichLim)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeCall *this_00;
  
  if (this->m_deferringAST != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x491,"(!this->m_deferringAST)","!this->m_deferringAST");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  VerifyNodeSize(nop,0x28);
  this_00 = (ParseNodeCall *)new<Memory::ArenaAllocator>(0x28,&this->m_nodeAllocator,0x35916e);
  ParseNodeCall::ParseNodeCall(this_00,nop,ichMin,ichLim,pnode1,pnode2);
  AddAstSize(this,0x28);
  return this_00;
}

Assistant:

ParseNodeCall * Parser::CreateCallNode(OpCode nop, ParseNodePtr pnode1, ParseNodePtr pnode2, charcount_t ichMin, charcount_t ichLim)
{
    Assert(!this->m_deferringAST);

    // Classes, derived from ParseNodeCall, can be created here as well,
    // as long as their size matches kcbPnCall (that is, they don't add
    // any data members of their own).
    DebugOnly(VerifyNodeSize(nop, sizeof(ParseNodeCall)));
    ParseNodeCall* pnode = Anew(&m_nodeAllocator, ParseNodeCall, nop, ichMin, ichLim, pnode1, pnode2);
    AddAstSize(sizeof(ParseNodeCall));

    return pnode;
}